

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

void wallet::wallet_tests::TestWatchOnlyPubKey(LegacyScriptPubKeyMan *spk_man,CPubKey *add_pubkey)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  bool is_pubkey_fully_valid;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock45;
  CPubKey found_pubkey;
  CKeyID add_address;
  CScript p2pk;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffff9d8;
  undefined7 in_stack_fffffffffffff9e0;
  undefined1 in_stack_fffffffffffff9e7;
  LegacyDataSPKM *in_stack_fffffffffffff9e8;
  lazy_ostream *in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f8;
  int in_stack_fffffffffffff9fc;
  const_string *in_stack_fffffffffffffa00;
  const_string *msg;
  LegacyDataSPKM *in_stack_fffffffffffffa08;
  undefined7 in_stack_fffffffffffffa10;
  undefined1 in_stack_fffffffffffffa17;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffa18;
  const_string *this;
  CPubKey *in_stack_fffffffffffffa20;
  undefined7 in_stack_fffffffffffffa28;
  undefined1 in_stack_fffffffffffffa2f;
  lazy_ostream local_4e8 [2];
  assertion_result local_4c8 [2];
  lazy_ostream local_470 [2];
  assertion_result local_450 [2];
  const_string local_418 [2];
  lazy_ostream local_3f8 [2];
  assertion_result local_3d8 [2];
  const_string local_3a0 [2];
  lazy_ostream local_380 [2];
  assertion_result local_360 [2];
  const_string local_328 [2];
  lazy_ostream local_308 [2];
  assertion_result local_2e8 [2];
  const_string local_2b0 [2];
  lazy_ostream local_290 [2];
  assertion_result local_270 [2];
  const_string local_238 [2];
  lazy_ostream local_218 [2];
  assertion_result local_1f8 [2];
  const_string local_1c0 [2];
  lazy_ostream local_1a0 [2];
  assertion_result local_180 [2];
  const_string local_148 [2];
  lazy_ostream local_128 [2];
  assertion_result local_108 [10];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  GetScriptForRawPubKey(in_stack_fffffffffffffa20);
  CPubKey::GetID((CPubKey *)in_stack_fffffffffffffa00);
  CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffff9d8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff9d8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffa18,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
             (char *)in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00,
             in_stack_fffffffffffff9fc,SUB41((uint)in_stack_fffffffffffff9f8 >> 0x18,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
               (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
               (unsigned_long)in_stack_fffffffffffff9d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffa18,
               (const_string *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
               (size_t)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    LegacyDataSPKM::HaveWatchOnly(in_stack_fffffffffffffa08,(CScript *)in_stack_fffffffffffffa00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff9e8,(bool)in_stack_fffffffffffff9e7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
               (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
               (unsigned_long)in_stack_fffffffffffff9d8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff9d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
               (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
               (unsigned_long)in_stack_fffffffffffff9d8);
    in_stack_fffffffffffff9d8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_108,local_128,local_148,0x1fe,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff9d8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff9d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  LegacyDataSPKM::LoadWatchOnly
            (in_stack_fffffffffffff9e8,
             (CScript *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
               (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
               (unsigned_long)in_stack_fffffffffffff9d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffa18,
               (const_string *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
               (size_t)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    LegacyDataSPKM::HaveWatchOnly(in_stack_fffffffffffffa08,(CScript *)in_stack_fffffffffffffa00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff9e8,(bool)in_stack_fffffffffffff9e7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
               (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
               (unsigned_long)in_stack_fffffffffffff9d8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff9d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
               (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
               (unsigned_long)in_stack_fffffffffffff9d8);
    in_stack_fffffffffffff9d8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_180,local_1a0,local_1c0,0x200,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff9d8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff9d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  bVar1 = CPubKey::IsFullyValid((CPubKey *)in_stack_fffffffffffff9f0);
  if (bVar1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
                 (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (unsigned_long)in_stack_fffffffffffff9d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffa18,
                 (const_string *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
                 (size_t)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
      LegacyDataSPKM::GetWatchPubKey
                ((LegacyDataSPKM *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
                 (CKeyID *)in_stack_fffffffffffffa08,(CPubKey *)in_stack_fffffffffffffa00);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff9e8,(bool)in_stack_fffffffffffff9e7);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
                 (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (unsigned_long)in_stack_fffffffffffff9d8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff9d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
                 (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (unsigned_long)in_stack_fffffffffffff9d8);
      in_stack_fffffffffffff9d8 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1f8,local_218,local_238,0x205,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffff9d8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff9d8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
                 (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (unsigned_long)in_stack_fffffffffffff9d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffa18,
                 (const_string *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
                 (size_t)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
      ::operator==((CPubKey *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                   (CPubKey *)in_stack_fffffffffffff9f0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff9e8,(bool)in_stack_fffffffffffff9e7);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
                 (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (unsigned_long)in_stack_fffffffffffff9d8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff9d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
                 (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (unsigned_long)in_stack_fffffffffffff9d8);
      in_stack_fffffffffffff9d8 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_270,local_290,local_2b0,0x206,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffff9d8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff9d8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  else {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
                 (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (unsigned_long)in_stack_fffffffffffff9d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffa18,
                 (const_string *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
                 (size_t)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
      LegacyDataSPKM::GetWatchPubKey
                ((LegacyDataSPKM *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
                 (CKeyID *)in_stack_fffffffffffffa08,(CPubKey *)in_stack_fffffffffffffa00);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff9e8,(bool)in_stack_fffffffffffff9e7);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
                 (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (unsigned_long)in_stack_fffffffffffff9d8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff9d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
                 (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (unsigned_long)in_stack_fffffffffffff9d8);
      in_stack_fffffffffffff9d8 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2e8,local_308,local_328,0x208,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffff9d8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff9d8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
                 (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (unsigned_long)in_stack_fffffffffffff9d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffa18,
                 (const_string *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
                 (size_t)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
      CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffff9d8);
      ::operator==((CPubKey *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                   (CPubKey *)in_stack_fffffffffffff9f0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff9e8,(bool)in_stack_fffffffffffff9e7);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
                 (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (unsigned_long)in_stack_fffffffffffff9d8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff9d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
                 (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (unsigned_long)in_stack_fffffffffffff9d8);
      in_stack_fffffffffffff9d8 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_360,local_380,local_3a0,0x209,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffff9d8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff9d8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  LegacyScriptPubKeyMan::RemoveWatchOnly
            ((LegacyScriptPubKeyMan *)CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28),
             (CScript *)in_stack_fffffffffffffa20);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
               (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
               (unsigned_long)in_stack_fffffffffffff9d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffa18,
               (const_string *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
               (size_t)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    LegacyDataSPKM::HaveWatchOnly(in_stack_fffffffffffffa08,(CScript *)in_stack_fffffffffffffa00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff9e8,(bool)in_stack_fffffffffffff9e7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
               (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
               (unsigned_long)in_stack_fffffffffffff9d8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff9d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
               (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
               (unsigned_long)in_stack_fffffffffffff9d8);
    in_stack_fffffffffffff9d8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3d8,local_3f8,local_418,0x20d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff9d8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff9d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  if (bVar1) {
    do {
      this = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
                 (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (unsigned_long)in_stack_fffffffffffff9d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)this,
                 (const_string *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
                 (size_t)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
      in_stack_fffffffffffffa17 =
           LegacyDataSPKM::GetWatchPubKey
                     ((LegacyDataSPKM *)
                      CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
                      (CKeyID *)in_stack_fffffffffffffa08,(CPubKey *)in_stack_fffffffffffffa00);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff9e8,(bool)in_stack_fffffffffffff9e7);
      in_stack_fffffffffffffa08 = (LegacyDataSPKM *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
                 (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (unsigned_long)in_stack_fffffffffffff9d8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff9d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
                 (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (unsigned_long)in_stack_fffffffffffff9d8);
      in_stack_fffffffffffff9d8 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_450,local_470,(const_string *)&stack0xfffffffffffffb70,0x210,CHECK,CHECK_PRED
                );
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffff9d8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff9d8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
                 (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (unsigned_long)in_stack_fffffffffffff9d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)this,
                 (const_string *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
                 (size_t)in_stack_fffffffffffffa08,msg);
      bVar1 = ::operator==((CPubKey *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                           (CPubKey *)in_stack_fffffffffffff9f0);
      in_stack_fffffffffffff9fc = CONCAT13(bVar1,(int3)in_stack_fffffffffffff9fc);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff9e8,(bool)in_stack_fffffffffffff9e7);
      in_stack_fffffffffffff9f0 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
                 (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (unsigned_long)in_stack_fffffffffffff9d8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff9d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8,
                 (pointer)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (unsigned_long)in_stack_fffffffffffff9d8);
      in_stack_fffffffffffff9d8 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_4c8,local_4e8,(const_string *)&stack0xfffffffffffffaf8,0x211,CHECK,CHECK_PRED
                );
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffff9d8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff9d8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff9d8);
  CScript::~CScript((CScript *)in_stack_fffffffffffff9d8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void TestWatchOnlyPubKey(LegacyScriptPubKeyMan* spk_man, const CPubKey& add_pubkey)
{
    CScript p2pk = GetScriptForRawPubKey(add_pubkey);
    CKeyID add_address = add_pubkey.GetID();
    CPubKey found_pubkey;
    LOCK(spk_man->cs_KeyStore);

    // all Scripts (i.e. also all PubKeys) are added to the general watch-only set
    BOOST_CHECK(!spk_man->HaveWatchOnly(p2pk));
    spk_man->LoadWatchOnly(p2pk);
    BOOST_CHECK(spk_man->HaveWatchOnly(p2pk));

    // only PubKeys on the curve shall be added to the watch-only address -> PubKey map
    bool is_pubkey_fully_valid = add_pubkey.IsFullyValid();
    if (is_pubkey_fully_valid) {
        BOOST_CHECK(spk_man->GetWatchPubKey(add_address, found_pubkey));
        BOOST_CHECK(found_pubkey == add_pubkey);
    } else {
        BOOST_CHECK(!spk_man->GetWatchPubKey(add_address, found_pubkey));
        BOOST_CHECK(found_pubkey == CPubKey()); // passed key is unchanged
    }

    spk_man->RemoveWatchOnly(p2pk);
    BOOST_CHECK(!spk_man->HaveWatchOnly(p2pk));

    if (is_pubkey_fully_valid) {
        BOOST_CHECK(!spk_man->GetWatchPubKey(add_address, found_pubkey));
        BOOST_CHECK(found_pubkey == add_pubkey); // passed key is unchanged
    }
}